

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O2

void __thiscall vector_bagwell<int,_16U>::push_back(vector_bagwell<int,_16U> *this,int *t)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  ulong uVar4;
  
  sVar2 = this->_left_in_block;
  if (sVar2 == 0) {
    uVar4 = (ulong)(uint)(0x10 << ((byte)((uint)(*(int *)&(this->_index_block).
                                                                                                                    
                                                  super__Vector_base<int_*,_std::allocator<int_*>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                *(int *)&(this->_index_block).
                                                                                                                  
                                                  super__Vector_base<int_*,_std::allocator<int_*>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 3) &
                                  0x1f));
    this->_left_in_block = uVar4;
    piVar3 = (int *)malloc(uVar4 << 2);
    this->_insertpos = piVar3;
    std::vector<int_*,_std::allocator<int_*>_>::push_back(&this->_index_block,&this->_insertpos);
    sVar2 = this->_left_in_block;
  }
  iVar1 = *t;
  piVar3 = this->_insertpos;
  this->_insertpos = piVar3 + 1;
  *piVar3 = iVar1;
  this->_left_in_block = sVar2 - 1;
  return;
}

Assistant:

void push_back(const T& t)
	{
		if (__builtin_expect(current_block_full(), false)) {
			_left_in_block = Initial << _index_block.size();
			_insertpos = static_cast<T*>(
					malloc(_left_in_block*sizeof(T)));
			_index_block.push_back(_insertpos);
		}
		*_insertpos++ = t;
		--_left_in_block;
	}